

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *cp)

{
  TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid> *in_RDX;
  TPZGeoMesh *in_RSI;
  TPZVec<long> *in_RDI;
  TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid> *unaff_retaddr;
  int64_t *this_00;
  pointer_____offset_0x60___ *copy;
  TPZVec<long> *vtt;
  
  vtt = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02471a98);
  TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid>::TPZGeoElRefLess
            (unaff_retaddr,&vtt->_vptr_TPZVec,in_RSI,in_RDX);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_02471770;
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_02471770;
  this_00 = &in_RDI[0x13].fNAlloc;
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)this_00,
             (TPZAutoPointer<TPZRefPattern> *)&in_RDI[0x14].fNAlloc);
  TPZVec<long>::operator=(in_RDI,(TPZVec<long> *)copy);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}